

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementSpring.cpp
# Opt level: O2

double __thiscall chrono::fea::ChElementSpring::GetCurrentForce(ChElementSpring *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer psVar3;
  element_type *peVar4;
  element_type *peVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChVector<double> v;
  ChVector<double> dir;
  undefined1 local_98 [16];
  double local_88;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_58 [16];
  double local_48;
  ChVector<double> local_40;
  
  psVar3 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar4 = (psVar3->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar5 = psVar3[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_98 = vsubpd_avx(*(undefined1 (*) [16])((long)&peVar5->super_ChNodeFEAbase + 0x20),
                        *(undefined1 (*) [16])((long)&peVar4->super_ChNodeFEAbase + 0x20));
  local_88 = *(double *)&peVar5->field_0x30 - *(double *)&peVar4->field_0x30;
  ChVector<double>::GetNormalized(&local_40,(ChVector<double> *)local_98);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(local_58);
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(local_78);
  local_98 = vsubpd_avx(local_58,local_78);
  local_88 = local_48 - local_68;
  dVar6 = ChVector<double>::Length((ChVector<double> *)local_98);
  psVar3 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar4 = (psVar3->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar5 = psVar3[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_98 = vsubpd_avx(*(undefined1 (*) [16])((long)&peVar5->super_ChNodeFEAbase + 0x20),
                        *(undefined1 (*) [16])((long)&peVar4->super_ChNodeFEAbase + 0x20));
  local_88 = *(double *)&peVar5->field_0x30 - *(double *)&peVar4->field_0x30;
  dVar7 = ChVector<double>::Length((ChVector<double> *)local_98);
  psVar3 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar4 = (psVar3->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar5 = psVar3[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_40.m_data[0];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)&peVar5->field_0x38 - *(double *)&peVar4->field_0x38;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (*(double *)&peVar5->field_0x40 - *(double *)&peVar4->field_0x40) *
                 local_40.m_data[1];
  auVar1 = vfmadd231sd_fma(auVar9,auVar8,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_40.m_data[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(double *)&peVar5->field_0x48 - *(double *)&peVar4->field_0x48;
  auVar1 = vfmadd231sd_fma(auVar1,auVar10,auVar2);
  return (dVar7 - dVar6) * this->spring_k + auVar1._0_8_ * this->damper_r;
}

Assistant:

double ChElementSpring::GetCurrentForce() {
	ChVector<> dir = (nodes[1]->GetPos() - nodes[0]->GetPos()).GetNormalized();
	double L_ref = (nodes[1]->GetX0() - nodes[0]->GetX0()).Length();
    double L = (nodes[1]->GetPos() - nodes[0]->GetPos()).Length();
    double L_dt = Vdot((nodes[1]->GetPos_dt() - nodes[0]->GetPos_dt()), dir);
    double internal_Kforce_local = this->spring_k * (L - L_ref);
    double internal_Rforce_local = this->damper_r * L_dt;
	return internal_Kforce_local + internal_Rforce_local;
}